

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamwriter.cpp
# Opt level: O3

bool __thiscall QCborStreamWriterPrivate::closeContainer(QCborStreamWriterPrivate *this)

{
  qsizetype *pqVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  size_t sVar7;
  anon_union_8_3_8ebc2b8a_for_data aVar8;
  uint8_t *puVar9;
  size_t sVar10;
  iterator iVar11;
  ssize_t sVar12;
  undefined8 in_RCX;
  size_t __n;
  size_t sVar13;
  char *msg;
  long in_FS_OFFSET;
  bool bVar14;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->containerStack).super_QList<CborEncoder>.d.size == 0) {
    closeContainer();
LAB_0049f797:
    bVar14 = false;
  }
  else {
    iVar11 = QList<CborEncoder>::end(&(this->containerStack).super_QList<CborEncoder>);
    sVar7 = iVar11.i[-1].remaining;
    iVar6 = iVar11.i[-1].flags;
    uVar2 = iVar11.i[-1].field_0x1c;
    uVar3 = iVar11.i[-1].field_0x1d;
    uVar4 = iVar11.i[-1].field_0x1e;
    uVar5 = iVar11.i[-1].field_0x1f;
    __n = CONCAT71((int7)((ulong)in_RCX >> 8),uVar5);
    pqVar1 = &(this->containerStack).super_QList<CborEncoder>.d.size;
    *pqVar1 = *pqVar1 + -1;
    aVar8 = (this->encoder).data;
    puVar9 = (this->encoder).end;
    if (((this->encoder).flags & 0x10) == 0) {
      sVar10 = (this->encoder).remaining;
      if (sVar10 == 1) {
        bVar14 = puVar9 != (uint8_t *)0x0;
        (this->encoder).data = aVar8;
        (this->encoder).end = puVar9;
        (this->encoder).remaining = sVar7;
        (this->encoder).flags = iVar6;
        (this->encoder).field_0x1c = uVar2;
        (this->encoder).field_0x1d = uVar3;
        (this->encoder).field_0x1e = uVar4;
        (this->encoder).field_0x1f = uVar5;
      }
      else {
        if (sVar10 == 0) {
          (this->encoder).data = aVar8;
          (this->encoder).end = puVar9;
          (this->encoder).remaining = sVar7;
          (this->encoder).flags = iVar6;
          (this->encoder).field_0x1c = uVar2;
          (this->encoder).field_0x1d = uVar3;
          (this->encoder).field_0x1e = uVar4;
          (this->encoder).field_0x1f = uVar5;
          msg = "QCborStreamWriter: too many items added to array or map";
        }
        else {
          (this->encoder).data = aVar8;
          (this->encoder).end = puVar9;
          (this->encoder).remaining = sVar7;
          (this->encoder).flags = iVar6;
          (this->encoder).field_0x1c = uVar2;
          (this->encoder).field_0x1d = uVar3;
          (this->encoder).field_0x1e = uVar4;
          (this->encoder).field_0x1f = uVar5;
          msg = "QCborStreamWriter: not enough items added to array or map";
        }
        local_58.context.category = "default";
        local_58.context.function._4_4_ = 0;
        local_58.context._12_8_ = 0;
        local_58.context._4_8_ = 0;
        local_58.context.version = 2;
        bVar14 = false;
        QMessageLogger::warning(&local_58,msg);
      }
      goto LAB_0049f840;
    }
    local_58.context.version = CONCAT31(local_58.context.version._1_3_,0xff);
    sVar13 = __n;
    if (*(QIODevice **)puVar9 != (QIODevice *)0x0) {
      sVar13 = __n & 0xffffffff;
      sVar12 = QIODevice::write(*(QIODevice **)puVar9,(int)&local_58,(void *)0x1,__n);
      if (sVar12 != 1) {
        (this->encoder).data = aVar8;
        (this->encoder).end = puVar9;
        (this->encoder).remaining = sVar7;
        (this->encoder).flags = iVar6;
        (this->encoder).field_0x1c = uVar2;
        (this->encoder).field_0x1d = uVar3;
        (this->encoder).field_0x1e = uVar4;
        (this->encoder).field_0x1f = (char)sVar13;
        goto LAB_0049f797;
      }
    }
    (this->encoder).data = aVar8;
    (this->encoder).end = puVar9;
    (this->encoder).remaining = sVar7;
    (this->encoder).flags = iVar6;
    (this->encoder).field_0x1c = uVar2;
    (this->encoder).field_0x1d = uVar3;
    (this->encoder).field_0x1e = uVar4;
    (this->encoder).field_0x1f = (char)sVar13;
    bVar14 = true;
  }
LAB_0049f840:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar14;
  }
  __stack_chk_fail();
}

Assistant:

bool closeContainer()
    {
        if (containerStack.isEmpty()) {
            qWarning("QCborStreamWriter: closing map or array that wasn't open");
            return false;
        }

        CborEncoder container = containerStack.pop();
        CborError err = cbor_encoder_close_container(&container, &encoder);
        encoder = container;

        if (Q_UNLIKELY(err)) {
            if (err == CborErrorTooFewItems)
                qWarning("QCborStreamWriter: not enough items added to array or map");
            else if (err == CborErrorTooManyItems)
                qWarning("QCborStreamWriter: too many items added to array or map");
            return false;
        }

        return true;
    }